

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O2

void __thiscall
cmParseJacocoCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  string *__k;
  cmCTest *pcVar1;
  char *pcVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  char **ppcVar9;
  string fileName;
  int local_3e0;
  undefined4 uStack_3dc;
  string local_3c0 [32];
  string line;
  ifstream fin;
  byte abStack_208 [488];
  
  bVar4 = std::operator==(name,"package");
  if (bVar4) {
    std::__cxx11::string::assign((char *)&this->PackageName);
    std::__cxx11::string::assign((char *)&this->PackagePath);
    return;
  }
  bVar4 = std::operator==(name,"sourcefile");
  if (!bVar4) {
    bVar4 = std::operator==(name,"line");
    if (!bVar4) {
      return;
    }
    ppcVar9 = atts + 1;
    uVar6 = 0xffffffff;
    iVar5 = -1;
    do {
      pcVar2 = ppcVar9[-1];
      if (*pcVar2 == 'n') {
        if ((pcVar2[1] == 'r') && (pcVar2[2] == '\0')) {
          uVar6 = atoi(*ppcVar9);
        }
      }
      else if (((*pcVar2 == 'c') && (pcVar2[1] == 'i')) && (pcVar2[2] == '\0')) {
        iVar5 = atoi(*ppcVar9);
      }
      ppcVar9 = ppcVar9 + 1;
    } while ((int)uVar6 < 1 || iVar5 < 0);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->Coverage->TotalCoverage,&this->FilePath);
    piVar3 = (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if (piVar3 == (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      return;
    }
    piVar3[(ulong)uVar6 - 1] = iVar5;
    return;
  }
  std::__cxx11::string::string((string *)&fileName,atts[1],(allocator *)&fin);
  bVar4 = std::operator==(&this->PackagePath,"");
  if (bVar4) {
    std::__cxx11::string::string(local_3c0,(string *)&fileName);
    iVar5 = (*(this->super_cmXMLParser)._vptr_cmXMLParser[0xe])(this,local_3c0);
    std::__cxx11::string::~string(local_3c0);
    if ((char)iVar5 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar7 = std::operator<<((ostream *)&fin,"Cannot find file: ");
      poVar7 = std::operator<<(poVar7,(string *)&this->PackageName);
      poVar7 = std::operator<<(poVar7,"/");
      poVar7 = std::operator<<(poVar7,(string *)&fileName);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                   ,0x32,line._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
      this->Coverage->Error = this->Coverage->Error + 1;
      goto LAB_002d0f72;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
  poVar7 = std::operator<<((ostream *)&fin,"Reading file: ");
  poVar7 = std::operator<<(poVar7,(string *)&fileName);
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
               ,0x3a,line._M_dataplus._M_p,this->Coverage->Quiet);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
  std::operator+(&line,&this->PackagePath,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,&line,
                 &fileName);
  __k = &this->FilePath;
  std::__cxx11::string::operator=((string *)__k,(string *)&fin);
  std::__cxx11::string::~string((string *)&fin);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::ifstream(&fin,(this->FilePath)._M_dataplus._M_p,_S_in);
  if ((abStack_208[*(long *)(_fin + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&line);
    poVar7 = std::operator<<((ostream *)&line,"Jacoco Coverage: Error opening ");
    poVar7 = std::operator<<(poVar7,(string *)__k);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                 ,0x42,(char *)CONCAT44(uStack_3dc,local_3e0),false);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&line);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](&this->Coverage->TotalCoverage,__k);
  if ((abStack_208[*(long *)(_fin + -0x18)] & 5) == 0) {
    local_3e0 = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pmVar8,&local_3e0);
  }
  while (bVar4 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1), bVar4)
  {
    local_3e0 = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pmVar8,&local_3e0);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&fin);
LAB_002d0f72:
  std::__cxx11::string::~string((string *)&fileName);
  return;
}

Assistant:

virtual void StartElement(const std::string& name,
      const char** atts)
      {
      if(name == "package")
        {
        this->PackageName = atts[1];
        this->PackagePath = "";
        }
      else if(name == "sourcefile")
        {
        std::string fileName = atts[1];

        if (this->PackagePath == "")
          {
          if(!this->FindPackagePath(fileName))
            {
            cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot find file: "
              << this->PackageName << "/" << fileName << std::endl);
            this->Coverage.Error++;
            return;
            }
          }

        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
          "Reading file: " << fileName << std::endl,
          this->Coverage.Quiet);

        this->FilePath = this->PackagePath + "/" + fileName;
        cmsys::ifstream fin(this->FilePath.c_str());
        if (!fin)
          {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Jacoco Coverage: Error opening " << this->FilePath
                     << std::endl);
          }
        std::string line;
        FileLinesType& curFileLines =
          this->Coverage.TotalCoverage[this->FilePath];
        if(fin)
          {
          curFileLines.push_back(-1);
          }
        while(cmSystemTools::GetLineFromStream(fin, line))
          {
          curFileLines.push_back(-1);
          }
        }
      else if(name == "line")
        {
        int tagCount = 0;
        int nr = -1;
        int ci = -1;
        while(true)
          {
          if(strcmp(atts[tagCount],"ci") == 0)
            {
            ci = atoi(atts[tagCount+1]);
            }
          else if (strcmp(atts[tagCount],"nr") == 0)
            {
            nr = atoi(atts[tagCount+1]);
            }
          if (ci > -1 && nr > 0)
            {
            FileLinesType& curFileLines=
              this->Coverage.TotalCoverage[this->FilePath];
            if(!curFileLines.empty())
               {
               curFileLines[nr-1] = ci;
               }
            break;
            }
          ++tagCount;
          }
        }
      }